

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O2

void __thiscall
QNetworkAccessManager::QNetworkAccessManager(QNetworkAccessManager *this,QObject *parent)

{
  int iVar1;
  QNetworkAccessManagerPrivate *this_00;
  QNetworkAccessManagerPrivate *this_01;
  long in_FS_OFFSET;
  Object local_38 [8];
  QBasicMutex *local_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QNetworkAccessManagerPrivate *)operator_new(0x108);
  QNetworkAccessManagerPrivate::QNetworkAccessManagerPrivate(this_00);
  this_01 = (QNetworkAccessManagerPrivate *)this;
  QObject::QObject((QObject *)this,(QObjectPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_002c9920;
  if (-2 < (char)QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::guard.
                 _q_value.super___atomic_base<signed_char>._M_i) {
    if (QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>>::
        instance()::holder == '\0') {
      this_01 = (QNetworkAccessManagerPrivate *)
                &QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>>
                 ::instance()::holder;
      iVar1 = __cxa_guard_acquire();
      if (iVar1 != 0) {
        __cxa_atexit(QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::
                     ~ApplicationHolder,
                     &QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>>
                      ::instance()::holder,&__dso_handle);
        this_01 = (QNetworkAccessManagerPrivate *)
                  &QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>>
                   ::instance()::holder;
        __cxa_guard_release();
      }
    }
    if ((__atomic_base<signed_char>)
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::guard._q_value.
        super___atomic_base<signed_char>._M_i != -1) {
      local_28 = 0xaaaaaaaaaaaaaa01;
      local_30 = &QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::mutex
      ;
      QBasicMutex::lock(&QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>
                         ::mutex);
      if ((__atomic_base<signed_char>)
          QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::guard.
          _q_value.super___atomic_base<signed_char>._M_i == '\0') {
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::storage.data =
             (uchar  [16])ZEXT816(0);
        QNetworkAccessFileBackendFactory::QNetworkAccessFileBackendFactory
                  ((QNetworkAccessFileBackendFactory *)
                   &QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::
                    storage);
        QObject::connect<void(QObject::*)(QObject*),void(&)()>
                  (local_38,QCoreApplication::self,(ContextType *)QObject::destroyed,
                   (_func_void *)0x0,(ConnectionType)QCoreApplication::self);
        QMetaObject::Connection::~Connection((Connection *)local_38);
        QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_fileBackend>::guard._q_value.
        super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
      }
      this_01 = (QNetworkAccessManagerPrivate *)&local_30;
      QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)this_01);
    }
  }
  QNetworkAccessManagerPrivate::ensureBackendPluginsLoaded(this_01);
  qMetaTypeId<QNetworkReply::NetworkError>();
  qMetaTypeId<QNetworkProxy>();
  qMetaTypeId<QList<QSslError>>();
  qMetaTypeId<QSslConfiguration>();
  qMetaTypeId<QSslPreSharedKeyAuthenticator*>();
  qMetaTypeId<QList<std::pair<QByteArray,QByteArray>>>();
  qMetaTypeId<QHttpNetworkRequest>();
  qMetaTypeId<QNetworkReply::NetworkError>();
  qMetaTypeId<QSharedPointer<char>>();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkAccessManager::QNetworkAccessManager(QObject *parent)
    : QObject(*new QNetworkAccessManagerPrivate, parent)
{
    ensureInitialized();
    d_func()->ensureBackendPluginsLoaded();

    qRegisterMetaType<QNetworkReply::NetworkError>();
#ifndef QT_NO_NETWORKPROXY
    qRegisterMetaType<QNetworkProxy>();
#endif
#ifndef QT_NO_SSL
    qRegisterMetaType<QList<QSslError> >();
    qRegisterMetaType<QSslConfiguration>();
    qRegisterMetaType<QSslPreSharedKeyAuthenticator *>();
#endif
    qRegisterMetaType<QList<std::pair<QByteArray, QByteArray>>>();
#if QT_CONFIG(http)
    qRegisterMetaType<QHttpNetworkRequest>();
#endif
    qRegisterMetaType<QNetworkReply::NetworkError>();
    qRegisterMetaType<QSharedPointer<char> >();
}